

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O3

void av1_generate_block_hash_value
               (IntraBCHashInfo *intrabc_hash_info,YV12_BUFFER_CONFIG *picture,int block_size,
               uint32_t **src_pic_block_hash,uint32_t **dst_pic_block_hash,
               int8_t **src_pic_block_same_info,int8_t **dst_pic_block_same_info)

{
  int iVar1;
  uint32_t *puVar2;
  int8_t *piVar3;
  long lVar4;
  long lVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 in_register_00000014;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int size_minus_1;
  uint uVar14;
  long lVar15;
  bool bVar16;
  uint32_t p [4];
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  int local_12c;
  uint local_128;
  int local_124;
  long local_120;
  long local_118;
  long local_110;
  ulong local_108;
  long local_100;
  long local_f8;
  undefined8 local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  CRC_CALCULATOR *local_68;
  CRC_CALCULATOR *local_60;
  int8_t **local_58;
  uint32_t **local_50;
  uint32_t **local_48;
  long local_40;
  long local_38;
  
  local_f0 = CONCAT44(in_register_00000014,block_size);
  iVar1 = (picture->field_3).field_0.y_crop_height;
  if (block_size <= iVar1) {
    local_60 = &intrabc_hash_info->crc_calculator1;
    local_68 = &intrabc_hash_info->crc_calculator2;
    iVar11 = (picture->field_2).field_0.y_crop_width;
    uVar13 = (ulong)(uint)(iVar11 - block_size);
    uVar14 = block_size - 1;
    local_a0 = (long)(iVar11 * (block_size >> 2));
    local_a8 = (long)(block_size >> 1);
    local_b0 = (long)(block_size >> 2);
    local_b8 = (long)(iVar11 * (block_size >> 1));
    local_108 = (ulong)((iVar11 - block_size) + 1);
    iVar11 = (iVar1 - block_size) + 1;
    local_c0 = local_a8 * 4;
    local_c8 = local_b0 + local_b8;
    local_d0 = local_b8 * 4;
    local_d8 = local_d0 + local_a8 * 4;
    local_e0 = local_a8 + local_b8;
    local_e8 = local_a8 + local_a0;
    local_90 = 0;
    local_124 = 0;
    local_12c = iVar11;
    local_128 = uVar14;
    local_98 = uVar13;
    local_58 = src_pic_block_same_info;
    local_50 = src_pic_block_hash;
    local_48 = dst_pic_block_hash;
    do {
      if (-1 < (int)uVar13) {
        lVar12 = (long)(int)local_90;
        local_70 = local_b0 + lVar12;
        local_38 = lVar12 * 4;
        local_40 = local_c0 + lVar12 * 4;
        local_110 = local_a8 + lVar12;
        local_88 = local_c8 + lVar12;
        local_f8 = local_d8 + lVar12 * 4;
        local_120 = local_e0 + lVar12;
        local_100 = local_d0 + lVar12 * 4;
        local_118 = local_b8 + lVar12;
        local_80 = local_e8 + lVar12;
        local_78 = local_a0 + lVar12;
        lVar15 = 0;
        do {
          lVar5 = local_38;
          lVar4 = local_40;
          puVar2 = *src_pic_block_hash;
          local_148 = *(undefined4 *)((long)puVar2 + lVar15 * 4 + local_38);
          local_144 = *(undefined4 *)((long)puVar2 + lVar15 * 4 + local_40);
          local_140 = *(undefined4 *)((long)puVar2 + lVar15 * 4 + local_100);
          local_13c = *(undefined4 *)((long)puVar2 + lVar15 * 4 + local_f8);
          uVar6 = av1_get_crc_value(local_60,(uint8_t *)&local_148,0x10);
          *(uint32_t *)((long)*dst_pic_block_hash + lVar15 * 4 + lVar5) = uVar6;
          puVar2 = src_pic_block_hash[1];
          local_148 = *(undefined4 *)((long)puVar2 + lVar15 * 4 + lVar5);
          local_144 = *(undefined4 *)((long)puVar2 + lVar15 * 4 + lVar4);
          local_140 = *(undefined4 *)((long)puVar2 + lVar15 * 4 + local_100);
          local_13c = *(undefined4 *)((long)puVar2 + lVar15 * 4 + local_f8);
          uVar6 = av1_get_crc_value(local_68,(uint8_t *)&local_148,0x10);
          *(uint32_t *)((long)dst_pic_block_hash[1] + lVar15 * 4 + lVar5) = uVar6;
          piVar3 = *local_58;
          if (piVar3[lVar15 + lVar12] == '\0') {
            bVar16 = false;
          }
          else if ((((piVar3[lVar15 + local_70] == '\0') || (piVar3[lVar15 + local_110] == '\0')) ||
                   (piVar3[lVar15 + local_118] == '\0')) || (piVar3[lVar15 + local_88] == '\0')) {
            bVar16 = false;
          }
          else {
            bVar16 = piVar3[lVar15 + local_120] != '\0';
          }
          (*dst_pic_block_same_info)[lVar15 + lVar12] = bVar16;
          piVar3 = local_58[1];
          if (((piVar3[lVar15 + lVar12] == '\0') || (piVar3[lVar15 + local_110] == '\0')) ||
             ((piVar3[lVar15 + local_78] == '\0' ||
              ((piVar3[lVar15 + local_80] == '\0' || (piVar3[lVar15 + local_118] == '\0')))))) {
            bVar16 = false;
          }
          else {
            bVar16 = piVar3[lVar15 + local_120] != '\0';
          }
          dst_pic_block_same_info[1][lVar15 + lVar12] = bVar16;
          lVar15 = lVar15 + 1;
        } while ((uint)local_108 != (int)lVar15);
        local_90 = (ulong)(uint)((int)local_90 + (int)lVar15);
        uVar13 = local_98;
        uVar14 = local_128;
        iVar11 = local_12c;
      }
      local_90 = (ulong)((int)local_90 + uVar14);
      local_124 = local_124 + 1;
    } while (local_124 != iVar11);
    iVar11 = (int)local_f0;
    if (3 < iVar11) {
      if (iVar11 <= iVar1) {
        uVar7 = 0;
        uVar8 = 0;
        do {
          if (-1 < (int)uVar13) {
            uVar10 = (ulong)uVar8;
            uVar9 = 0;
            do {
              if (((*dst_pic_block_same_info)[uVar10] == '\0') &&
                 (dst_pic_block_same_info[1][uVar10] == '\0')) {
                bVar16 = true;
              }
              else {
                bVar16 = ((uVar9 | uVar7) & uVar14) == 0;
              }
              dst_pic_block_same_info[2][uVar10] = bVar16;
              uVar10 = uVar10 + 1;
              uVar9 = uVar9 + 1;
            } while ((uint)local_108 != uVar9);
            uVar8 = uVar8 + uVar9;
          }
          uVar8 = uVar8 + uVar14;
          uVar7 = uVar7 + 1;
        } while (uVar7 != (iVar1 - iVar11) + 1U);
      }
    }
  }
  return;
}

Assistant:

void av1_generate_block_hash_value(IntraBCHashInfo *intrabc_hash_info,
                                   const YV12_BUFFER_CONFIG *picture,
                                   int block_size,
                                   uint32_t *src_pic_block_hash[2],
                                   uint32_t *dst_pic_block_hash[2],
                                   int8_t *src_pic_block_same_info[3],
                                   int8_t *dst_pic_block_same_info[3]) {
  CRC_CALCULATOR *calc_1 = &intrabc_hash_info->crc_calculator1;
  CRC_CALCULATOR *calc_2 = &intrabc_hash_info->crc_calculator2;

  const int pic_width = picture->y_crop_width;
  const int x_end = picture->y_crop_width - block_size + 1;
  const int y_end = picture->y_crop_height - block_size + 1;

  const int src_size = block_size >> 1;
  const int quad_size = block_size >> 2;

  uint32_t p[4];
  const int length = sizeof(p);

  int pos = 0;
  for (int y_pos = 0; y_pos < y_end; y_pos++) {
    for (int x_pos = 0; x_pos < x_end; x_pos++) {
      p[0] = src_pic_block_hash[0][pos];
      p[1] = src_pic_block_hash[0][pos + src_size];
      p[2] = src_pic_block_hash[0][pos + src_size * pic_width];
      p[3] = src_pic_block_hash[0][pos + src_size * pic_width + src_size];
      dst_pic_block_hash[0][pos] =
          av1_get_crc_value(calc_1, (uint8_t *)p, length);

      p[0] = src_pic_block_hash[1][pos];
      p[1] = src_pic_block_hash[1][pos + src_size];
      p[2] = src_pic_block_hash[1][pos + src_size * pic_width];
      p[3] = src_pic_block_hash[1][pos + src_size * pic_width + src_size];
      dst_pic_block_hash[1][pos] =
          av1_get_crc_value(calc_2, (uint8_t *)p, length);

      dst_pic_block_same_info[0][pos] =
          src_pic_block_same_info[0][pos] &&
          src_pic_block_same_info[0][pos + quad_size] &&
          src_pic_block_same_info[0][pos + src_size] &&
          src_pic_block_same_info[0][pos + src_size * pic_width] &&
          src_pic_block_same_info[0][pos + src_size * pic_width + quad_size] &&
          src_pic_block_same_info[0][pos + src_size * pic_width + src_size];

      dst_pic_block_same_info[1][pos] =
          src_pic_block_same_info[1][pos] &&
          src_pic_block_same_info[1][pos + src_size] &&
          src_pic_block_same_info[1][pos + quad_size * pic_width] &&
          src_pic_block_same_info[1][pos + quad_size * pic_width + src_size] &&
          src_pic_block_same_info[1][pos + src_size * pic_width] &&
          src_pic_block_same_info[1][pos + src_size * pic_width + src_size];
      pos++;
    }
    pos += block_size - 1;
  }

  if (block_size >= 4) {
    const int size_minus_1 = block_size - 1;
    pos = 0;
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      for (int x_pos = 0; x_pos < x_end; x_pos++) {
        dst_pic_block_same_info[2][pos] =
            (!dst_pic_block_same_info[0][pos] &&
             !dst_pic_block_same_info[1][pos]) ||
            (((x_pos & size_minus_1) == 0) && ((y_pos & size_minus_1) == 0));
        pos++;
      }
      pos += block_size - 1;
    }
  }
}